

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

int * __thiscall CSnapshotBuilder::GetItemData(CSnapshotBuilder *this,int Key)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)(uint)this->m_NumItems;
  if (this->m_NumItems < 1) {
    uVar2 = 0;
  }
  uVar3 = 0;
  do {
    if (uVar2 == uVar3) {
      return (int *)0x0;
    }
    piVar1 = this->m_aOffsets + uVar3;
    uVar3 = uVar3 + 1;
  } while (*(int *)(this->m_aData + *piVar1) != Key);
  return (int *)(this->m_aData + (long)*piVar1 + 4);
}

Assistant:

int *CSnapshotBuilder::GetItemData(int Key) const
{
	for(int i = 0; i < m_NumItems; i++)
	{
		if(GetItem(i)->Key() == Key)
			return GetItem(i)->Data();
	}
	return 0;
}